

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KruskalMST.h
# Opt level: O3

double __thiscall KruskalMST::operator()(KruskalMST *this)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  socklen_t in_ECX;
  int N;
  Edge *edge;
  pointer pEVar4;
  double local_48;
  UFS local_40;
  
  N = this->n;
  UFS::UFS(&local_40,N);
  pEVar4 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 == pEVar1) {
    local_48 = 0.0;
  }
  else {
    local_48 = 0.0;
    do {
      iVar3 = pEVar4->to;
      iVar2 = UFS::find(&local_40,pEVar4->from);
      iVar3 = UFS::find(&local_40,iVar3);
      if (iVar2 != iVar3) {
        UFS::connect(&local_40,pEVar4->from,(sockaddr *)(ulong)(uint)pEVar4->to,in_ECX);
        local_48 = local_48 + pEVar4->w;
        N = N + -1;
        if (N == 1) break;
      }
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar1);
  }
  if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
      local_40.fa._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (int *)0x0) {
    operator_delete__((void *)local_40.fa._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  return local_48;
}

Assistant:

double operator()() const
	{
		double ans = 0.0;
		int need = n;
		UFS ufs(n);
		for (auto &edge : edges)
		{
			if (!ufs.connected(edge.from, edge.to))
			{
				ufs.connect(edge.from, edge.to);
				ans += edge.w;
				if (--need == 1)
					break;
			}
		}
		return ans;
	}